

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<char,_true,_5>_> __thiscall
immutable::rrb_details::rrb_drop_left<char,true,5>
          (rrb_details *this,ref<immutable::rrb<char,_true,_5>_> *in,uint32_t left)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  uint32_t *puVar5;
  uint uVar6;
  rrb<char,_true,_5> *prVar7;
  leaf_node<char,_true> *plVar8;
  rrb<char,_true,_5> *prVar9;
  rrb<char,_true,_5> *prVar10;
  internal_node<char,_true> *piVar11;
  rrb_size_table<true> *prVar12;
  tree_node<char,_true> *ptVar13;
  uint local_94;
  uint local_90;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t i_3;
  ref<immutable::rrb_details::leaf_node<char,_true>_> new_tail_2;
  ref<immutable::rrb_details::leaf_node<char,_true>_> new_root;
  uint32_t tail_cut;
  uint local_68;
  uint local_64;
  uint32_t i_2;
  uint32_t i_1;
  ref<immutable::rrb_details::leaf_node<char,_true>_> new_tail_1;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_50;
  ref<immutable::rrb_details::internal_node<char,_true>_> root;
  ref<immutable::rrb<char,_true,_5>_> new_rrb;
  uint local_2c;
  uint32_t i;
  ref<immutable::rrb_details::leaf_node<char,_true>_> new_tail;
  uint32_t remaining;
  uint32_t left_local;
  ref<immutable::rrb<char,_true,_5>_> *in_local;
  ref<immutable::rrb<char,_true,_5>_> *new_rrb_1;
  
  new_tail.ptr._4_4_ = left;
  prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
  if (left < prVar7->cnt) {
    if (new_tail.ptr._4_4_ != 0) {
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      uVar6 = prVar7->cnt - new_tail.ptr._4_4_;
      new_tail.ptr._0_4_ = uVar6;
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      if (uVar6 <= prVar7->tail_len) {
        plVar8 = leaf_node_create<char,true>((uint)new_tail.ptr);
        ref<immutable::rrb_details::leaf_node<char,_true>_>::ref
                  ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffffd8,
                   plVar8);
        for (local_2c = 0; local_2c < (uint)new_tail.ptr; local_2c = local_2c + 1) {
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->(&prVar7->tail);
          pcVar4 = plVar8->child;
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          cVar1 = pcVar4[(prVar7->tail_len - (uint)new_tail.ptr) + local_2c];
          plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)
                              &stack0xffffffffffffffd8);
          plVar8->child[local_2c] = cVar1;
        }
        rrb_create<char,true,5>();
        uVar2 = (uint)new_tail.ptr;
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                           ((ref<immutable::rrb<char,_true,_5>_> *)this);
        uVar3 = (uint)new_tail.ptr;
        prVar7->cnt = uVar2;
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                           ((ref<immutable::rrb<char,_true,_5>_> *)this);
        prVar7->tail_len = uVar3;
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                           ((ref<immutable::rrb<char,_true,_5>_> *)this);
        ref<immutable::rrb_details::leaf_node<char,_true>_>::operator=
                  (&prVar7->tail,
                   (ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffffd8);
        ref<immutable::rrb_details::leaf_node<char,_true>_>::~ref
                  ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&stack0xffffffffffffffd8);
        return (ref<immutable::rrb<char,_true,_5>_>)(rrb<char,_true,_5> *)this;
      }
      rrb_create<char,true,5>();
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                         ((ref<immutable::rrb<char,_true,_5>_> *)&root);
      prVar9 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      uVar2 = new_tail.ptr._4_4_;
      prVar10 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      rrb_drop_left_rec<char,true,5>
                ((rrb_details *)&new_tail_1,&prVar7->shift,&prVar9->root,uVar2,prVar10->shift,false)
      ;
      ref<immutable::rrb_details::internal_node<char,true>>::
      ref<immutable::rrb_details::tree_node<char,true>>
                ((ref<immutable::rrb_details::internal_node<char,true>> *)&local_50,
                 (ref<immutable::rrb_details::tree_node<char,_true>_> *)&new_tail_1);
      ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&new_tail_1);
      uVar2 = (uint)new_tail.ptr;
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                         ((ref<immutable::rrb<char,_true,_5>_> *)&root);
      prVar7->cnt = uVar2;
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                         ((ref<immutable::rrb<char,_true,_5>_> *)&root);
      ref<immutable::rrb_details::tree_node<char,true>>::operator=
                ((ref<immutable::rrb_details::tree_node<char,true>> *)&prVar7->root,&local_50);
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                         ((ref<immutable::rrb<char,_true,_5>_> *)&root);
      if ((prVar7->shift != 0) &&
         (piVar11 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_50),
         (piVar11->size_table).ptr != (rrb_size_table<true> *)0x0)) {
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                           ((ref<immutable::rrb<char,_true,_5>_> *)&root);
        uVar2 = prVar7->cnt;
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        uVar3 = prVar7->tail_len;
        piVar11 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_50);
        prVar12 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                            (&piVar11->size_table);
        puVar5 = prVar12->size;
        piVar11 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&local_50);
        puVar5[piVar11->len - 1] = uVar2 - uVar3;
      }
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      prVar9 = ref<immutable::rrb<char,_true,_5>_>::operator->
                         ((ref<immutable::rrb<char,_true,_5>_> *)&root);
      ref<immutable::rrb_details::leaf_node<char,_true>_>::operator=(&prVar9->tail,&prVar7->tail);
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      uVar2 = prVar7->tail_len;
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->
                         ((ref<immutable::rrb<char,_true,_5>_> *)&root);
      prVar7->tail_len = uVar2;
      ref<immutable::rrb<char,_true,_5>_>::operator=
                (in,(ref<immutable::rrb<char,_true,_5>_> *)&root);
      ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&local_50);
      ref<immutable::rrb<char,_true,_5>_>::~ref((ref<immutable::rrb<char,_true,_5>_> *)&root);
    }
    prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
    if ((prVar7->shift == 0) &&
       (prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in),
       (prVar7->root).ptr != (tree_node<char,_true> *)0x0)) {
      prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
      if (prVar7->cnt < 0x21) {
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        plVar8 = leaf_node_create<char,true>(prVar7->cnt);
        ref<immutable::rrb_details::leaf_node<char,_true>_>::ref
                  ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_2,plVar8);
        local_64 = 0;
        while( true ) {
          uVar6 = local_64;
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          ptVar13 = ref<immutable::rrb_details::tree_node<char,_true>_>::operator->(&prVar7->root);
          if (ptVar13->len <= uVar6) break;
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          cVar1 = *(char *)(*(long *)((prVar7->root).ptr + 1) + (ulong)local_64);
          plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_2);
          plVar8->child[local_64] = cVar1;
          local_64 = local_64 + 1;
        }
        for (local_68 = 0; uVar6 = local_68,
            prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in), uVar6 < prVar7->tail_len;
            local_68 = local_68 + 1) {
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->(&prVar7->tail);
          cVar1 = plVar8->child[local_68];
          plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_2);
          pcVar4 = plVar8->child;
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          ptVar13 = ref<immutable::rrb_details::tree_node<char,_true>_>::operator->(&prVar7->root);
          pcVar4[ptVar13->len + local_68] = cVar1;
        }
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        uVar2 = prVar7->cnt;
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        prVar7->tail_len = uVar2;
        ref<immutable::rrb_details::tree_node<char,_true>_>::ref
                  ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&stack0xffffffffffffff90,
                   (tree_node<char,_true> *)0x0);
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        ref<immutable::rrb_details::tree_node<char,_true>_>::operator=
                  (&prVar7->root,
                   (ref<immutable::rrb_details::tree_node<char,_true>_> *)&stack0xffffffffffffff90);
        ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&stack0xffffffffffffff90);
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        ref<immutable::rrb_details::leaf_node<char,_true>_>::operator=
                  (&prVar7->tail,(ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_2);
        ref<immutable::rrb_details::leaf_node<char,_true>_>::~ref
                  ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_2);
      }
      else {
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        uVar2 = prVar7->cnt;
        prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
        if (uVar2 - prVar7->tail_len < 0x20) {
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          ptVar13 = ref<immutable::rrb_details::tree_node<char,_true>_>::operator->(&prVar7->root);
          uVar6 = 0x20 - ptVar13->len;
          plVar8 = leaf_node_create<char,true>(0x20);
          ref<immutable::rrb_details::leaf_node<char,_true>_>::ref(&new_tail_2,plVar8);
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          plVar8 = leaf_node_create<char,true>(prVar7->tail_len - uVar6);
          ref<immutable::rrb_details::leaf_node<char,_true>_>::ref
                    ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_4,plVar8);
          i_5 = 0;
          while( true ) {
            prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
            ptVar13 = ref<immutable::rrb_details::tree_node<char,_true>_>::operator->(&prVar7->root)
            ;
            if (ptVar13->len <= i_5) break;
            prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
            cVar1 = *(char *)(*(long *)((prVar7->root).ptr + 1) + (ulong)i_5);
            plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->(&new_tail_2);
            plVar8->child[i_5] = cVar1;
            i_5 = i_5 + 1;
          }
          for (local_90 = 0; local_90 < uVar6; local_90 = local_90 + 1) {
            prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
            plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->(&prVar7->tail);
            cVar1 = plVar8->child[local_90];
            plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->(&new_tail_2);
            pcVar4 = plVar8->child;
            prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
            ptVar13 = ref<immutable::rrb_details::tree_node<char,_true>_>::operator->(&prVar7->root)
            ;
            pcVar4[ptVar13->len + local_90] = cVar1;
          }
          for (local_94 = 0; prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in),
              local_94 < prVar7->tail_len - uVar6; local_94 = local_94 + 1) {
            prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
            plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->(&prVar7->tail);
            cVar1 = plVar8->child[uVar6 + local_94];
            plVar8 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                               ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_4);
            plVar8->child[local_94] = cVar1;
          }
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          uVar2 = prVar7->tail_len;
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          prVar7->tail_len = uVar2 - uVar6;
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          ref<immutable::rrb_details::leaf_node<char,_true>_>::operator=
                    (&prVar7->tail,(ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_4);
          prVar7 = ref<immutable::rrb<char,_true,_5>_>::operator->(in);
          ref<immutable::rrb_details::tree_node<char,true>>::operator=
                    ((ref<immutable::rrb_details::tree_node<char,true>> *)&prVar7->root,&new_tail_2)
          ;
          ref<immutable::rrb_details::leaf_node<char,_true>_>::~ref
                    ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&i_4);
          ref<immutable::rrb_details::leaf_node<char,_true>_>::~ref(&new_tail_2);
        }
      }
    }
    ref<immutable::rrb<char,_true,_5>_>::ref((ref<immutable::rrb<char,_true,_5>_> *)this,in);
  }
  else {
    rrb_create<char,true,5>();
  }
  return (ref<immutable::rrb<char,_true,_5>_>)(rrb<char,_true,_5> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_left(ref<rrb<T, atomic_ref_counting, N>> in, uint32_t left)
      {
      using namespace rrb_details;
      if (left >= in->cnt)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (left > 0)
        {
        const uint32_t remaining = in->cnt - left;

        // If we slice into the tail, we just need to modify the tail itself
        if (remaining <= in->tail_len)
          {
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(remaining);
          //memcpy(new_tail->child, &in->tail->child[in->tail_len - remaining], remaining * sizeof(T));
          for (uint32_t i = 0; i < remaining; ++i)
            new_tail->child[i] = in->tail->child[in->tail_len - remaining + i]; // don't memcpy, but use copy constructor

          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
          new_rrb->cnt = remaining;
          new_rrb->tail_len = remaining;
          new_rrb->tail = new_tail;
          return new_rrb;
          }
        // Otherwise, we don't really have to take the tail into consideration.
        // Good!

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<internal_node<T, atomic_ref_counting>> root = rrb_drop_left_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, left, in->shift, false);
        new_rrb->cnt = remaining;
        new_rrb->root = root;

        // Ensure last element in size table is correct size, if the root is an
        // internal node.
        if (new_rrb->shift != 0 && root->size_table.ptr != nullptr)
          {
          root->size_table->size[root->len - 1] = new_rrb->cnt - in->tail_len;
          }
        new_rrb->tail = in->tail;
        new_rrb->tail_len = in->tail_len;
        in = new_rrb;
        }

      // TODO: I think the code below also applies to root nodes where size_table
      // == NULL and (cnt - tail_len) & 0xff != 0, but it may be that this is
      // resolved by rrb_drop_right itself. Perhaps not promote in the right slicing,
      // but here instead?

      // This case handles leaf nodes < RRB_BRANCHING size, by redistributing
      // values from the tail into the actual leaf node.
      if (in->shift == 0 && in->root.ptr != nullptr)
        {
        // two cases to handle: cnt <= RRB_BRANCHING
        //     and (cnt - tail_len) < RRB_BRANCHING

        if (in->cnt <= bits<N>::rrb_branching)
          {
          // can put all into a new tail
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(in->cnt);
          //memcpy(&new_tail->child[0], &((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[0], in->root->len * sizeof(T));
          for (uint32_t i = 0; i < in->root->len; ++i)
            new_tail->child[i] = ((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_tail->child[in->root->len], &in->tail->child[0], in->tail_len * sizeof(T));
          for (uint32_t i = 0; i < in->tail_len; ++i)
            new_tail->child[in->root->len + i] = in->tail->child[i]; // don't memcpy, but use copy constructor
          in->tail_len = in->cnt;
          in->root = ref<tree_node<T, atomic_ref_counting>>(nullptr);
          in->tail = new_tail;
          }
        // no need for <= here, because if the root node is == rrb_branching, the
        // invariant is kept.
        else if (in->cnt - in->tail_len < bits<N>::rrb_branching)
          {
          // create both a new tail and a new root node
          const uint32_t tail_cut = bits<N>::rrb_branching - in->root->len;
          ref<leaf_node<T, atomic_ref_counting>> new_root = leaf_node_create<T, atomic_ref_counting>(bits<N>::rrb_branching);
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(in->tail_len - tail_cut);

          //memcpy(&new_root->child[0], &((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[0], in->root->len * sizeof(T));
          for (uint32_t i = 0; i < in->root->len; ++i)
            new_root->child[i] = ((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_root->child[in->root->len], &in->tail->child[0], tail_cut * sizeof(T));
          for (uint32_t i = 0; i < tail_cut; ++i)
            new_root->child[in->root->len + i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_tail->child[0], &in->tail->child[tail_cut], (in->tail_len - tail_cut) * sizeof(T));
          for (uint32_t i = 0; i < (in->tail_len - tail_cut); ++i)
            new_tail->child[i] = in->tail->child[tail_cut + i]; // don't memcpy, but use copy constructor

          in->tail_len = in->tail_len - tail_cut;
          in->tail = new_tail;
          in->root = new_root;
          }
        }
      return in;
      }